

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IsReadOnly(Parse *pParse,Table *pTab,int viewOk)

{
  VTable *pVVar1;
  VTable *pVVar2;
  sqlite3 *psVar3;
  uint uVar4;
  char *zFormat;
  
  if (pTab->eTabType == '\x01') {
    pVVar1 = (pTab->u).vtab.p;
    for (pVVar2 = pVVar1; (pVVar2 != (VTable *)0x0 && (pVVar2->db != pParse->db));
        pVVar2 = pVVar2->pNext) {
    }
    if (pVVar2->pMod->pModule->xUpdate ==
        (_func_int_sqlite3_vtab_ptr_int_sqlite3_value_ptr_ptr_sqlite3_int64_ptr *)0x0) {
LAB_001abc97:
      zFormat = "table %s may not be modified";
      goto LAB_001abc9e;
    }
    if ((pParse->pToplevel != (Parse *)0x0) &&
       (((uint)pParse->db->flags >> 7 & 1) < (uint)pVVar1->eVtabRisk)) {
      sqlite3ErrorMsg(pParse,"unsafe use of virtual table \"%s\"",pTab->zName);
    }
  }
  else if ((pTab->tabFlags & 0x1001) != 0) {
    psVar3 = pParse->db;
    uVar4 = (uint)psVar3->flags;
    if ((pTab->tabFlags & 1) == 0) {
      if ((((uVar4 >> 0x1c & 1) != 0) &&
          ((psVar3->pVtabCtx == (VtabCtx *)0x0 && (psVar3->nVdbeExec == 0)))) &&
         ((zFormat = "table %s may not be modified", psVar3->nVTrans < 1 ||
          (psVar3->aVTrans != (VTable **)0x0)))) goto LAB_001abc9e;
    }
    else if (((uVar4 & 0x10000001) != 1) && (pParse->nested == '\0')) goto LAB_001abc97;
  }
  if (viewOk != 0) {
    return 0;
  }
  if (pTab->eTabType != '\x02') {
    return 0;
  }
  zFormat = "cannot modify %s because it is a view";
LAB_001abc9e:
  sqlite3ErrorMsg(pParse,zFormat,pTab->zName);
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3IsReadOnly(Parse *pParse, Table *pTab, int viewOk){
  if( tabIsReadOnly(pParse, pTab) ){
    sqlite3ErrorMsg(pParse, "table %s may not be modified", pTab->zName);
    return 1;
  }
#ifndef SQLITE_OMIT_VIEW
  if( !viewOk && IsView(pTab) ){
    sqlite3ErrorMsg(pParse,"cannot modify %s because it is a view",pTab->zName);
    return 1;
  }
#endif
  return 0;
}